

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::ReturnArrayMemory(SerialArena *this,void *p,size_t size)

{
  CachedBlock **ppCVar1;
  type tVar2;
  unsigned_long *puVar3;
  CachedBlock *new_node;
  CachedBlock **cached_head;
  void *local_40;
  ulong local_38;
  size_t new_size;
  CachedBlock **new_list;
  size_t index;
  size_t size_local;
  void *p_local;
  SerialArena *this_local;
  
  index = size;
  size_local = (size_t)p;
  p_local = this;
  if (size < 0x10) {
    protobuf_assumption_failed
              ("size >= 16",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
               ,0x9d);
  }
  tVar2 = absl::lts_20250127::bit_width<unsigned_long>(size);
  new_list = (CachedBlock **)(long)(tVar2 + -5);
  if (new_list < (CachedBlock **)(ulong)this->cached_block_length_) {
    ppCVar1 = this->cached_blocks_;
    *(CachedBlock **)size_local = ppCVar1[(long)new_list];
    ppCVar1[(long)new_list] = (CachedBlock *)size_local;
    PoisonMemoryRegion((void *)size_local,index);
  }
  else {
    new_size = size_local;
    local_38 = index >> 3;
    std::
    copy<google::protobuf::internal::SerialArena::CachedBlock**,google::protobuf::internal::SerialArena::CachedBlock**>
              (this->cached_blocks_,this->cached_blocks_ + (int)(uint)this->cached_block_length_,
               (CachedBlock **)size_local);
    UnpoisonMemoryRegion
              ((void *)(new_size + (long)(int)(uint)this->cached_block_length_ * 8),
               (local_38 - this->cached_block_length_) * 8);
    local_40 = (void *)0x0;
    std::fill<google::protobuf::internal::SerialArena::CachedBlock**,decltype(nullptr)>
              ((CachedBlock **)(new_size + (long)(int)(uint)this->cached_block_length_ * 8),
               (CachedBlock **)(new_size + local_38 * 8),&local_40);
    this->cached_blocks_ = (CachedBlock **)new_size;
    cached_head = (CachedBlock **)0x40;
    puVar3 = std::min<unsigned_long>((unsigned_long *)&cached_head,&local_38);
    this->cached_block_length_ = (uint8_t)*puVar3;
  }
  return;
}

Assistant:

void ReturnArrayMemory(void* p, size_t size) {
    // We only need to check for 32-bit platforms.
    // In 64-bit platforms the minimum allocation size from Repeated*Field will
    // be 16 guaranteed.
    if (sizeof(void*) < 8) {
      if (ABSL_PREDICT_FALSE(size < 16)) return;
    } else {
      PROTOBUF_ASSUME(size >= 16);
    }

    // We round down to the next smaller block in case the memory doesn't match
    // the pattern we are looking for. eg, someone might have called Reserve()
    // on the repeated field.
    const size_t index = absl::bit_width(size) - 5;

    if (ABSL_PREDICT_FALSE(index >= cached_block_length_)) {
      // We can't put this object on the freelist so make this object the
      // freelist. It is guaranteed it is larger than the one we have, and
      // large enough to hold another allocation of `size`.
      CachedBlock** new_list = static_cast<CachedBlock**>(p);
      size_t new_size = size / sizeof(CachedBlock*);

      std::copy(cached_blocks_, cached_blocks_ + cached_block_length_,
                new_list);

      // We need to unpoison this memory before filling it in case it has been
      // poisoned by another sanitizer client.
      internal::UnpoisonMemoryRegion(
          new_list + cached_block_length_,
          (new_size - cached_block_length_) * sizeof(CachedBlock*));

      std::fill(new_list + cached_block_length_, new_list + new_size, nullptr);

      cached_blocks_ = new_list;
      // Make the size fit in uint8_t. This is the power of two, so we don't
      // need anything larger.
      cached_block_length_ =
          static_cast<uint8_t>(std::min(size_t{64}, new_size));

      return;
    }

    auto& cached_head = cached_blocks_[index];
    auto* new_node = static_cast<CachedBlock*>(p);
    new_node->next = cached_head;
    cached_head = new_node;
    internal::PoisonMemoryRegion(p, size);
  }